

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexical.cpp
# Opt level: O0

bool fs_is_safe_char(char c)

{
  int iVar1;
  size_type sVar2;
  bool local_a;
  char c_local;
  
  iVar1 = isalnum((int)c);
  local_a = true;
  if (iVar1 == 0) {
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                      (&fs_is_safe_char::safe,c,0);
    local_a = sVar2 != 0xffffffffffffffff;
  }
  return local_a;
}

Assistant:

static bool
fs_is_safe_char(const char c)
{
  // unordered_set<char>  8us
  // set<char, std::less<>>  6us
  // vector<char> 0.3us so much faster!
  // <string_view>.find_first_of is same speed as vector<char> but more readable
  static constexpr std::string_view safe = "_-.~@#$%^&()[]{}+=,!";

  return std::isalnum(c) || safe.find_first_of(c) != std::string::npos;
}